

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpReply.hpp
# Opt level: O0

HttpReply * __thiscall HttpReply::ExtractCookie(HttpReply *this,string *reply,char *cookie)

{
  long lVar1;
  allocator local_49;
  ulong local_48;
  size_t valueEnd;
  allocator local_29;
  ulong local_28;
  size_t valueStart;
  char *cookie_local;
  string *reply_local;
  
  valueStart = (size_t)cookie;
  cookie_local = (char *)reply;
  reply_local = (string *)this;
  local_28 = std::__cxx11::string::find((char *)reply,(ulong)cookie);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    lVar1 = std::__cxx11::string::find((char)cookie_local,0x3d);
    local_28 = lVar1 + 1;
    local_48 = std::__cxx11::string::find_first_of(cookie_local,0x17a32e);
    if ((local_48 == 0xffffffffffffffff) || (local_48 <= local_28)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",&local_49);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else {
      std::__cxx11::string::substr((ulong)this,(ulong)cookie_local);
    }
  }
  return this;
}

Assistant:

static std::string ExtractCookie(const std::string& reply, const char* cookie) {
        size_t valueStart = reply.find(cookie);
        if (valueStart == std::string::npos) return "";
        valueStart = reply.find('=', valueStart) + 1;
        size_t valueEnd = reply.find_first_of(";\r", valueStart);
        if (valueEnd == std::string::npos || valueEnd <= valueStart) return "";
        return reply.substr(valueStart, valueEnd - valueStart);
    }